

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O3

bool ON_GetPointListBoundingBox
               (int dim,bool is_rat,int count,int stride,double *points,double *boxmin,
               double *boxmax,int bGrowBox)

{
  size_t __n;
  double dVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  
  bVar9 = bGrowBox != 0;
  if (bVar9 && 0 < dim) {
    uVar7 = 1;
    do {
      lVar2 = uVar7 - 1;
      lVar3 = uVar7 - 1;
      bVar9 = boxmin[lVar2] <= boxmax[lVar3];
      if ((uint)dim <= uVar7) break;
      uVar7 = uVar7 + 1;
    } while (boxmin[lVar2] <= boxmax[lVar3]);
  }
  if (count < 1) {
    return bVar9;
  }
  if ((points == (double *)0x0 || dim < 1) || ((count != 1 && (stride < (int)((uint)is_rat + dim))))
     ) {
    return false;
  }
  if (is_rat) {
    uVar7 = (ulong)(uint)dim;
    pdVar4 = points + uVar7;
    dVar1 = *pdVar4;
    while ((dVar1 == 0.0 && (!NAN(dVar1)))) {
      if (count < 2) {
        return false;
      }
      count = count + -1;
      pdVar6 = points + (long)stride + uVar7;
      points = points + stride;
      dVar1 = *pdVar6;
    }
    bVar8 = *pdVar4 != 0.0;
    if (!bVar9) {
      ON_ArrayScale(dim,1.0 / dVar1,points,boxmin);
      memcpy(boxmax,boxmin,uVar7 * 8);
      count = count + -1;
      if (count == 0) {
        return bVar8;
      }
      points = points + stride;
    }
    do {
      dVar1 = points[uVar7];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        uVar5 = 0;
        pdVar4 = boxmax;
        do {
          dVar10 = points[uVar5] * (1.0 / dVar1);
          if (boxmin[uVar5] <= dVar10) {
            pdVar6 = pdVar4;
            if (*pdVar4 <= dVar10 && dVar10 != *pdVar4) goto LAB_003e1907;
          }
          else {
            pdVar6 = boxmin + uVar5;
LAB_003e1907:
            *pdVar6 = dVar10;
          }
          uVar5 = uVar5 + 1;
          pdVar4 = pdVar4 + 1;
        } while (uVar7 != uVar5);
      }
      else {
        bVar8 = false;
      }
      count = count + -1;
      points = points + stride;
      if (count == 0) {
        return bVar8;
      }
    } while( true );
  }
  if (!bVar9) {
    __n = (ulong)(uint)dim * 8;
    memcpy(boxmin,points,__n);
    memmove(boxmax,points,__n);
    count = count + -1;
    if (count == 0) {
      return true;
    }
    points = points + stride;
  }
  do {
    count = count + -1;
    uVar7 = 0;
    pdVar4 = boxmax;
    do {
      dVar1 = points[uVar7];
      if (boxmin[uVar7] <= dVar1) {
        pdVar6 = pdVar4;
        if (*pdVar4 <= dVar1 && dVar1 != *pdVar4) goto LAB_003e1818;
      }
      else {
        pdVar6 = boxmin + uVar7;
LAB_003e1818:
        *pdVar6 = dVar1;
      }
      uVar7 = uVar7 + 1;
      pdVar4 = pdVar4 + 1;
    } while ((uint)dim != uVar7);
    points = points + stride;
    if (count == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool ON_GetPointListBoundingBox( 
    int dim, bool is_rat, int count, int stride, const double* points, 
    double* boxmin, double* boxmax,
    int bGrowBox
    )
/*****************************************************************************
Bounding Box of a set of points
 
INPUT:
  dim           ( >= 1 ) dimension of each point
  is_rat        ( true if points are rational )
  count         ( >= 1 ) number of points
  stride        ( >= (is_rat)?(dim+1):dim )
  points        array of dim*count doubles
  boxmin, boxmax      unused arrays of dim doubles
  bGrowBox       true if input box should be enlarged to contain points
										boxmin[i]>boxmax[i] for some i, represents an empty initial box
                 false if input box should be ignored bounding box of points
                       is returned
OUTPUT:
  boxmin, boxmax      diagonal corners of bounding box
*****************************************************************************/
{
  // OBSOLETE
  // bounding box workhorse
  double x, w;
  int j;
  bool rc = false;
  for ( j = 0; j < dim && bGrowBox; j++ )
  {
    if ( boxmin[j] > boxmax[j] )
      bGrowBox = false;
  }

  if ( count > 0 ) 
  {
    if ( is_rat )
    {
      is_rat = 1;
    }
    if ( points && dim > 0 && (count == 1 || stride >= dim+is_rat) ) 
    {
      // input is valid list of a least 1 point

      if ( is_rat ) 
      {
        // bounding box of homogeneous rational points
        rc = true;
        while ( count > 0 && points[dim] == 0.0 ) 
        {
          count--;
          points += stride;
          rc = false;
        }
        if ( count > 0 ) 
        {
          if ( !bGrowBox  )
          {
            ON_ArrayScale( dim, 1.0/points[dim], points, boxmin );
            memcpy( boxmax, boxmin, dim*sizeof(*boxmax) );
            points += stride;
            count--;
            bGrowBox = true;
          }
          if ( count > 0 ) 
          {
            for ( /*empty*/; count--; points += stride ) 
            {
              if ( points[dim] == 0.0 ) {
                rc = false;
                continue;
              }
              w = 1.0/points[dim];
              for ( j = 0; j < dim; j++ ) 
              {
                x = w*points[j];
                if (boxmin[j] > x) 
                  boxmin[j] = x; 
                else if (boxmax[j] < x) 
                  boxmax[j] = x;
              }
            }
          }
        }
      }
      else 
      {
        // bounding box of non-rational points
        rc = true;
        if ( !bGrowBox ) 
        {
          // use first point to initialize box 
          memcpy( boxmin, points, dim*sizeof(*boxmin) );
          memcpy( boxmax, boxmin, dim*sizeof(*boxmax) );
          points += stride;
          count--;
          bGrowBox = true;
        }
        if ( count ) 
        {
          // grow box to contain the rest of the points
          for ( /*empty*/; count--; points += stride ) 
          {
            for ( j = 0; j < dim; j++ ) 
            {
              x = points[j];
              if (boxmin[j] > x) 
                boxmin[j] = x; 
              else if (boxmax[j] < x) 
                boxmax[j] = x;
            }
          }
        }
      }
    }
  }
  else if ( bGrowBox ) 
  {
    // result is still valid if no points are added to a valid input box
    rc = true;
  }
  return rc;
}